

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler-ls.h
# Opt level: O0

string * __thiscall
wabt::LoadStoreTracking::GenAlign_abi_cxx11_
          (string *__return_storage_ptr__,LoadStoreTracking *this,Address align,Opcode opc)

{
  bool bVar1;
  undefined4 in_register_0000000c;
  string local_48;
  byte local_26;
  allocator local_25;
  uint local_24;
  LoadStoreTracking *pLStack_20;
  Address align_local;
  LoadStoreTracking *this_local;
  string *psStack_10;
  Opcode opc_local;
  
  local_24 = align;
  pLStack_20 = this;
  this_local._4_4_ = opc.enum_;
  psStack_10 = __return_storage_ptr__;
  bVar1 = Opcode::IsNaturallyAligned((Opcode *)((long)&this_local + 4),align);
  local_26 = 0;
  if (bVar1) {
    std::allocator<char>::allocator();
    local_26 = 1;
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_25);
  }
  else {
    std::__cxx11::to_string(&local_48,local_24);
    cat<char[2],std::__cxx11::string>
              (__return_storage_ptr__,(wabt *)0x2dceb5,(char (*) [2])&local_48,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_register_0000000c,opc.enum_));
    std::__cxx11::string::~string((string *)&local_48);
  }
  if ((local_26 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_25);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenAlign(Address align, Opcode opc) const {
    return opc.IsNaturallyAligned(align)
      ? ""
      : cat("@", std::to_string(align));
  }